

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ping-pong.c
# Opt level: O0

void tcp_pinger_v6_new(int vectored_writes)

{
  int iVar1;
  uint32_t *puVar2;
  uv_loop_t *loop;
  pinger_t *pinger;
  sockaddr_in6 server_addr;
  int r;
  int vectored_writes_local;
  
  server_addr.sin6_scope_id = vectored_writes;
  iVar1 = uv_ip6_addr("::1",0x23a3,(sockaddr_in6 *)((long)&pinger + 4));
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ping-pong.c"
            ,0xaf,"0 ==uv_ip6_addr(\"::1\", TEST_PORT, &server_addr)");
    abort();
  }
  puVar2 = (uint32_t *)malloc(0x2978);
  if (puVar2 == (uint32_t *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ping-pong.c"
            ,0xb1,"pinger != NULL");
    abort();
  }
  *puVar2 = server_addr.sin6_scope_id;
  puVar2[2] = 0;
  puVar2[1] = 0;
  loop = uv_default_loop();
  server_addr.sin6_addr.__in6_u.__u6_addr32[3] = uv_tcp_init(loop,(uv_tcp_t *)(puVar2 + 4));
  *(uint32_t **)(puVar2 + 4) = puVar2;
  if (server_addr.sin6_addr.__in6_u.__u6_addr32[3] != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ping-pong.c"
            ,0xb9,"!r");
    abort();
  }
  server_addr.sin6_addr.__in6_u.__u6_addr32[3] =
       uv_tcp_connect((uv_connect_t *)(puVar2 + 0x46),(uv_tcp_t *)(puVar2 + 4),
                      (sockaddr *)((long)&pinger + 4),pinger_on_connect);
  if (server_addr.sin6_addr.__in6_u.__u6_addr32[3] != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ping-pong.c"
            ,0xc1,"!r");
    abort();
  }
  if (pinger_on_connect_count != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ping-pong.c"
            ,0xc4,"pinger_on_connect_count == 0");
    abort();
  }
  return;
}

Assistant:

static void tcp_pinger_v6_new(int vectored_writes) {
  int r;
  struct sockaddr_in6 server_addr;
  pinger_t *pinger;


  ASSERT(0 ==uv_ip6_addr("::1", TEST_PORT, &server_addr));
  pinger = malloc(sizeof(*pinger));
  ASSERT(pinger != NULL);
  pinger->vectored_writes = vectored_writes;
  pinger->state = 0;
  pinger->pongs = 0;

  /* Try to connect to the server and do NUM_PINGS ping-pongs. */
  r = uv_tcp_init(uv_default_loop(), &pinger->stream.tcp);
  pinger->stream.tcp.data = pinger;
  ASSERT(!r);

  /* We are never doing multiple reads/connects at a time anyway, so these
   * handles can be pre-initialized. */
  r = uv_tcp_connect(&pinger->connect_req,
                     &pinger->stream.tcp,
                     (const struct sockaddr*) &server_addr,
                     pinger_on_connect);
  ASSERT(!r);

  /* Synchronous connect callbacks are not allowed. */
  ASSERT(pinger_on_connect_count == 0);
}